

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::FieldOptions::ByteSizeLong(FieldOptions *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  type_conflict tVar4;
  FieldOptions_CType value;
  FieldOptions_JSType value_00;
  FieldOptions_OptionRetention value_01;
  size_t sVar5;
  RepeatedField<int> *value_02;
  size_t sVar6;
  size_t sVar7;
  RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *this_00;
  reference value_03;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *this_01;
  reference value_04;
  uint32_t *puVar8;
  UninterpretedOption *msg_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *__range3_1;
  FieldOptions_EditionDefault *msg;
  const_iterator __end3;
  const_iterator __begin3;
  RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *__range3;
  size_t tag_size;
  size_t data_size;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  FieldOptions *this_;
  FieldOptions *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  sVar5 = internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  value_02 = _internal_targets(this);
  sVar6 = internal::WireFormatLite::EnumSize(value_02);
  iVar3 = _internal_targets_size(this);
  sVar7 = internal::FromIntSize(iVar3);
  iVar3 = _internal_edition_defaults_size(this);
  sStack_58 = (long)iVar3 * 2 + sVar6 + sVar7 * 2 + sVar5;
  this_00 = _internal_edition_defaults(this);
  __end3 = RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault>::begin(this_00);
  msg = (FieldOptions_EditionDefault *)
        RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault>::end(this_00);
  while (bVar2 = internal::operator!=(&__end3,(iterator *)&msg), bVar2) {
    value_03 = internal::RepeatedPtrIterator<const_google::protobuf::FieldOptions_EditionDefault>::
               operator*(&__end3);
    sVar5 = internal::WireFormatLite::MessageSize<google::protobuf::FieldOptions_EditionDefault>
                      (value_03);
    sStack_58 = sVar5 + sStack_58;
    internal::RepeatedPtrIterator<const_google::protobuf::FieldOptions_EditionDefault>::operator++
              (&__end3);
  }
  iVar3 = _internal_uninterpreted_option_size(this);
  sStack_58 = (long)iVar3 * 2 + sStack_58;
  this_01 = _internal_uninterpreted_option(this);
  __end3_1 = RepeatedPtrField<google::protobuf::UninterpretedOption>::begin(this_01);
  msg_1 = (UninterpretedOption *)
          RepeatedPtrField<google::protobuf::UninterpretedOption>::end(this_01);
  while (bVar2 = internal::operator!=(&__end3_1,(iterator *)&msg_1), bVar2) {
    value_04 = internal::RepeatedPtrIterator<const_google::protobuf::UninterpretedOption>::operator*
                         (&__end3_1);
    sVar5 = internal::WireFormatLite::MessageSize<google::protobuf::UninterpretedOption>(value_04);
    sStack_58 = sVar5 + sStack_58;
    internal::RepeatedPtrIterator<const_google::protobuf::UninterpretedOption>::operator++
              (&__end3_1);
  }
  puVar8 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar8;
  tVar4 = absl::lts_20250127::popcount<unsigned_int>(uVar1 & 0x178);
  sStack_58 = (long)(tVar4 << 1) + (long)(int)((uint)((uVar1 & 0x200) != 0) * 3) + sStack_58;
  if ((uVar1 & 0x87) != 0) {
    if ((uVar1 & 1) != 0) {
      sVar5 = internal::WireFormatLite::MessageSize<google::protobuf::FeatureSet>
                        ((this->field_0)._impl_.features_);
      sStack_58 = sVar5 + 2 + sStack_58;
    }
    if ((uVar1 & 2) != 0) {
      sVar5 = internal::WireFormatLite::MessageSize<google::protobuf::FieldOptions_FeatureSupport>
                        ((this->field_0)._impl_.feature_support_);
      sStack_58 = sVar5 + 2 + sStack_58;
    }
    if ((uVar1 & 4) != 0) {
      value = _internal_ctype(this);
      sVar5 = internal::WireFormatLite::EnumSize(value);
      sStack_58 = sVar5 + 1 + sStack_58;
    }
    if ((uVar1 & 0x80) != 0) {
      value_00 = _internal_jstype(this);
      sVar5 = internal::WireFormatLite::EnumSize(value_00);
      sStack_58 = sVar5 + 1 + sStack_58;
    }
  }
  if ((uVar1 & 0x400) != 0) {
    value_01 = _internal_retention(this);
    sVar5 = internal::WireFormatLite::EnumSize(value_01);
    sStack_58 = sVar5 + 2 + sStack_58;
  }
  sVar5 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar5;
}

Assistant:

::size_t FieldOptions::ByteSizeLong() const {
  const FieldOptions& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.FieldOptions)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.FieldOptions.OptionTargetType targets = 19;
    {
      ::size_t data_size =
          ::_pbi::WireFormatLite::EnumSize(this_._internal_targets());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_targets_size());
      total_size += data_size + tag_size;
    }
    // repeated .google.protobuf.FieldOptions.EditionDefault edition_defaults = 20;
    {
      total_size += 2UL * this_._internal_edition_defaults_size();
      for (const auto& msg : this_._internal_edition_defaults()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
    {
      total_size += 2UL * this_._internal_uninterpreted_option_size();
      for (const auto& msg : this_._internal_uninterpreted_option()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  total_size += static_cast<bool>(0x00000200u & cached_has_bits) * 3;
  total_size += ::absl::popcount(0x00000178u & cached_has_bits) * 2;
  if ((cached_has_bits & 0x00000087u) != 0) {
    // optional .google.protobuf.FeatureSet features = 21;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.features_);
    }
    // optional .google.protobuf.FieldOptions.FeatureSupport feature_support = 22;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.feature_support_);
    }
    // optional .google.protobuf.FieldOptions.CType ctype = 1 [default = STRING];
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_ctype());
    }
    // optional .google.protobuf.FieldOptions.JSType jstype = 6 [default = JS_NORMAL];
    if ((cached_has_bits & 0x00000080u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_jstype());
    }
  }
   {
    // optional .google.protobuf.FieldOptions.OptionRetention retention = 17;
    if ((cached_has_bits & 0x00000400u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_retention());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}